

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rearrangeFunctions.cpp
# Opt level: O2

string * __thiscall GraphNode::dotGraph_abi_cxx11_(string *__return_storage_ptr__,GraphNode *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  iterator iVar2;
  const_iterator __position;
  shared_ptr<GraphNode> pointer;
  __shared_ptr<GraphNode,_(__gnu_cxx::_Lock_policy)2> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::to_string(&local_b0,this->m_value);
  std::operator+(&local_f0,"\t",&local_b0);
  std::operator+(__return_storage_ptr__,&local_f0,"\n");
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_b0);
  for (__position._M_current =
            (this->m_pointers).
            super__Vector_base<std::weak_ptr<GraphNode>,_std::allocator<std::weak_ptr<GraphNode>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      __position._M_current !=
      (this->m_pointers).
      super__Vector_base<std::weak_ptr<GraphNode>,_std::allocator<std::weak_ptr<GraphNode>_>_>.
      _M_impl.super__Vector_impl_data._M_finish; __position._M_current = __position._M_current + 1)
  {
    p_Var1 = ((__position._M_current)->super___weak_ptr<GraphNode,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    if ((p_Var1 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
       (p_Var1->_M_use_count == 0)) {
      iVar2 = std::vector<std::weak_ptr<GraphNode>,_std::allocator<std::weak_ptr<GraphNode>_>_>::
              erase(&this->m_pointers,__position);
      __position._M_current = iVar2._M_current + -1;
    }
    else {
      std::__shared_ptr<GraphNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_100,__position._M_current);
      std::__cxx11::to_string(&local_70,this->m_value);
      std::operator+(&local_50,"\t",&local_70);
      std::operator+(&local_d0,&local_50,"->");
      std::__cxx11::to_string(&local_90,(local_100._M_ptr)->m_value);
      std::operator+(&local_b0,&local_d0,&local_90);
      std::operator+(&local_f0,&local_b0,"\n");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_100._M_refcount);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GraphNode::dotGraph() {
    std::string result = "\t" + std::to_string(m_value) + "\n";
    for (auto iter = m_pointers.begin(); iter != m_pointers.end(); iter++)
        if (iter->expired()) {
            iter = m_pointers.erase(iter);
            iter--;
        } else {
            auto pointer = iter->lock();
            result += "\t" + std::to_string(m_value) + "->" + std::to_string(pointer->m_value) + "\n";
        }

    return result;
}